

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlHandle __thiscall
despot::util::tinyxml::TiXmlHandle::ChildElement(TiXmlHandle *this,char *value,int count)

{
  bool bVar1;
  TiXmlElement *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  int iVar2;
  bool bVar3;
  
  if (*(TiXmlNode **)value != (TiXmlNode *)0x0) {
    this_00 = TiXmlNode::FirstChildElement
                        (*(TiXmlNode **)value,(char *)CONCAT44(in_register_00000014,count));
    bVar3 = this_00 != (TiXmlElement *)0x0;
    if (0 < in_ECX && bVar3) {
      iVar2 = 1;
      do {
        this_00 = TiXmlNode::NextSiblingElement
                            (&this_00->super_TiXmlNode,(char *)CONCAT44(in_register_00000014,count))
        ;
        bVar3 = this_00 != (TiXmlElement *)0x0;
        if (this_00 == (TiXmlElement *)0x0) break;
        bVar1 = iVar2 < in_ECX;
        iVar2 = iVar2 + 1;
      } while (bVar1);
    }
    if (bVar3) goto LAB_00170f32;
  }
  this_00 = (TiXmlElement *)0x0;
LAB_00170f32:
  this->node = &this_00->super_TiXmlNode;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement(const char* value, int count) const {
	if (node) {
		int i;
		TiXmlElement* child = node->FirstChildElement(value);
		for (i = 0; child && i < count;
			child = child->NextSiblingElement(value), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}